

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DTDElementDecl::faultInAttDefList(DTDElementDecl *this)

{
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *this_00;
  
  this_00 = (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)
            XMemory::operator_new(0x38,(this->super_XMLElementDecl).fMemoryManager);
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher>::RefHashTableOf
            (this_00,0x1d,true,(this->super_XMLElementDecl).fMemoryManager);
  this->fAttDefs = this_00;
  return;
}

Assistant:

void DTDElementDecl::faultInAttDefList() const
{
    // Use a hash modulus of 29 and tell it owns its elements
    ((DTDElementDecl*)this)->fAttDefs = new (getMemoryManager()) RefHashTableOf<DTDAttDef>(29, true, getMemoryManager());
}